

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3Error(sqlite3 *db,int err_code)

{
  Mem *p;
  _func_int_sqlite3_vfs_ptr_int_char_ptr *p_Var1;
  int iVar2;
  
  db->errCode = err_code;
  if (err_code != 0) {
    p = db->pErr;
    if (p != (Mem *)0x0) {
      if ((p->flags & 0x9000) == 0) {
        p->flags = 1;
      }
      else {
        vdbeMemClearExternAndSetNull(p);
      }
    }
    if ((err_code & 0xfbU) == 10 && err_code != 0xc0a) {
      p_Var1 = db->pVfs->xGetLastError;
      if (p_Var1 == (_func_int_sqlite3_vfs_ptr_int_char_ptr *)0x0) {
        iVar2 = 0;
      }
      else {
        iVar2 = (*p_Var1)(db->pVfs,0,(char *)0x0);
      }
      db->iSysErrno = iVar2;
    }
    return;
  }
  if (db->pErr != (sqlite3_value *)0x0) {
    sqlite3ErrorFinish(db,0);
    return;
  }
  db->errByteOffset = -1;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Error(sqlite3 *db, int err_code){
  assert( db!=0 );
  db->errCode = err_code;
  if( err_code || db->pErr ){
    sqlite3ErrorFinish(db, err_code);
  }else{
    db->errByteOffset = -1;
  }
}